

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RegexCompile::maxMatchLength(RegexCompile *this,int32_t start,int32_t end)

{
  UVector64 *pUVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int64_t iVar9;
  char cVar10;
  int32_t iVar11;
  uint uVar12;
  UVector32 forwardedLength;
  UVector32 local_50;
  
  uVar7 = 0;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = end + 1;
    UVector32::UVector32(&local_50,iVar2,this->fStatus);
    UVector32::setSize(&local_50,iVar2);
    if (start <= end) {
      iVar11 = start;
      do {
        UVector32::setElementAt(&local_50,0,iVar11);
        iVar11 = iVar11 + 1;
      } while (iVar2 != iVar11);
    }
    uVar7 = 0;
    if (start <= end) {
      uVar7 = 0;
      do {
        pUVar1 = this->fRXPat->fCompiledPat;
        iVar2 = pUVar1->count;
        if (start < 0) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          if (start < iVar2) {
            iVar9 = pUVar1->elements[(uint)start];
          }
        }
        iVar6 = 0;
        if (((-1 < start) && (iVar6 = 0, 0 < local_50.count)) && (start < local_50.count)) {
          iVar6 = local_50.elements[(uint)start];
        }
        uVar3 = uVar7;
        if ((int)uVar7 < iVar6) {
          uVar3 = 0;
        }
        if (((-1 < start) && ((int)uVar7 < iVar6)) &&
           ((uVar3 = 0, 0 < local_50.count && (start < local_50.count)))) {
          uVar3 = local_50.elements[(uint)start];
        }
        uVar5 = (uint)iVar9;
        uVar7 = uVar3;
        uVar12 = start;
        switch((uint)((ulong)iVar9 >> 0x18) & 0xff) {
        case 1:
          uVar7 = 0;
          if (((-2 < start) && (0 < local_50.count)) && ((int)(start + 1U) < local_50.count)) {
            uVar7 = local_50.elements[start + 1U];
          }
          break;
        default:
          goto switchD_0016d889_caseD_2;
        case 3:
          uVar7 = uVar3 + 1;
          if ((uVar3 & 0xfffffffe) == 0x7ffffffe) {
            uVar7 = 0x7fffffff;
          }
          if ((0x10000 < (uVar5 & 0xffffff)) &&
             (uVar3 = uVar7 & 0xfffffffe, uVar7 = uVar7 + 1, uVar3 == 0x7ffffffe)) {
            uVar7 = 0x7fffffff;
          }
          break;
        case 4:
        case 0x28:
          uVar12 = start + 1;
          uVar5 = 0;
          if ((-2 < start) && (uVar5 = 0, (int)uVar12 < iVar2)) {
            uVar5 = *(uint *)(pUVar1->elements + uVar12) & 0xffffff;
          }
          uVar7 = uVar5 + uVar3;
          if ((uVar3 ^ 0x7fffffff) <= uVar5) {
            uVar7 = 0x7fffffff;
          }
          break;
        case 6:
          uVar4 = uVar5 & 0xffffff;
          uVar7 = 0x7fffffff;
          if (start < (int)uVar4) {
            iVar2 = 0;
            if ((int)uVar4 < local_50.count) {
              iVar2 = local_50.elements[uVar5 & 0xffffff];
            }
            uVar7 = uVar3;
            if ((int)uVar3 <= iVar2) goto switchD_0016d889_caseD_2;
            UVector32::setElementAt(&local_50,uVar3,uVar4);
          }
          break;
        case 10:
        case 0xb:
        case 0xc:
        case 0x15:
        case 0x16:
        case 0x1b:
        case 0x27:
        case 0x31:
        case 0x38:
        case 0x39:
        case 0x3a:
          uVar7 = uVar3 + 2;
          if (0xfffffffc < (uVar3 | 0x80000000)) {
            uVar7 = 0x7fffffff;
          }
          goto switchD_0016d889_caseD_2;
        case 0xd:
        case 0xf:
        case 0x12:
        case 0x24:
          uVar4 = uVar5 & 0xffffff;
          uVar7 = 0x7fffffff;
          if (start <= (int)uVar4) {
            uVar7 = 0;
            iVar2 = 0;
            if ((int)uVar4 < local_50.count) {
              iVar2 = local_50.elements[uVar5 & 0xffffff];
            }
            if (iVar2 < (int)uVar3) {
              UVector32::setElementAt(&local_50,uVar3,uVar4);
            }
          }
          break;
        case 0x13:
        case 0x22:
        case 0x29:
        case 0x32:
        case 0x33:
        case 0x34:
          uVar7 = 0x7fffffff;
          break;
        case 0x19:
        case 0x1a:
          uVar5 = 0;
          if ((-2 < start) && ((int)(start + 1U) < iVar2)) {
            uVar5 = *(uint *)(pUVar1->elements + (start + 1U)) & 0xffffff;
          }
          uVar12 = uVar5;
          if (uVar5 != start + 4U) {
            if (start < -3) {
              iVar6 = 0;
            }
            else {
              iVar6 = 0;
              if ((int)(start + 3U) < iVar2) {
                iVar6 = (int)pUVar1->elements[start + 3U];
              }
            }
            uVar7 = 0x7fffffff;
            uVar12 = start;
            if (iVar6 != -1) {
              iVar11 = maxMatchLength(this,start + 4U,uVar5 - 1);
              lVar8 = (long)iVar6 * (long)iVar11 + (long)(int)uVar3;
              uVar7 = (uint)lVar8;
              uVar12 = uVar5;
              if (0x7ffffffe < lVar8) {
                uVar7 = 0x7fffffff;
                uVar12 = start;
              }
            }
          }
          break;
        case 0x2c:
          iVar6 = 0;
          while( true ) {
            do {
              uVar3 = start;
              start = uVar3 + 1;
              cVar10 = '\0';
              if ((-2 < (int)uVar3) && (start < iVar2)) {
                cVar10 = *(char *)((long)pUVar1->elements + (ulong)(uint)start * 8 + 3);
              }
              if ((cVar10 == ',') || (cVar10 == '%')) {
                iVar6 = iVar6 + 1;
              }
            } while ((cVar10 != '&') && (cVar10 != '0'));
            if (iVar6 == 0) break;
            iVar6 = iVar6 + -1;
          }
          start = uVar3 + 1;
switchD_0016d889_caseD_2:
          uVar12 = start;
        }
        if (uVar7 == 0x7fffffff) {
          uVar7 = 0x7fffffff;
          break;
        }
        start = uVar12 + 1;
      } while ((int)uVar12 < end);
    }
    UVector32::~UVector32(&local_50);
  }
  return uVar7;
}

Assistant:

int32_t   RegexCompile::maxMatchLength(int32_t start, int32_t end) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    U_ASSERT(start <= end);
    U_ASSERT(end < fRXPat->fCompiledPat->size());


    int32_t    loc;
    int32_t    op;
    int32_t    opType;
    int32_t    currentLen = 0;
    UVector32  forwardedLength(end+1, *fStatus);
    forwardedLength.setSize(end+1);

    for (loc=start; loc<=end; loc++) {
        forwardedLength.setElementAt(0, loc);
    }

    for (loc = start; loc<=end; loc++) {
        op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
        opType = URX_TYPE(op);

        // The loop is advancing linearly through the pattern.
        // If the op we are now at was the destination of a branch in the pattern,
        // and that path has a longer maximum length than the current accumulated value,
        // replace the current accumulated value.
        if (forwardedLength.elementAti(loc) > currentLen) {
            currentLen = forwardedLength.elementAti(loc);
        }

        switch (opType) {
            // Ops that don't change the total length matched
        case URX_RESERVED_OP:
        case URX_END:
        case URX_STRING_LEN:
        case URX_NOP:
        case URX_START_CAPTURE:
        case URX_END_CAPTURE:
        case URX_BACKSLASH_B:
        case URX_BACKSLASH_BU:
        case URX_BACKSLASH_G:
        case URX_BACKSLASH_Z:
        case URX_CARET:
        case URX_DOLLAR:
        case URX_DOLLAR_M:
        case URX_DOLLAR_D:
        case URX_DOLLAR_MD:
        case URX_RELOC_OPRND:
        case URX_STO_INP_LOC:
        case URX_CARET_M:
        case URX_CARET_M_UNIX:

        case URX_STO_SP:          // Setup for atomic or possessive blocks.  Doesn't change what can match.
        case URX_LD_SP:

        case URX_LB_END:
        case URX_LB_CONT:
        case URX_LBN_CONT:
        case URX_LBN_END:
            break;


            // Ops that increase that cause an unbounded increase in the length
            //   of a matched string, or that increase it a hard to characterize way.
            //   Call the max length unbounded, and stop further checking.
        case URX_BACKREF:         // BackRef.  Must assume that it might be a zero length match
        case URX_BACKREF_I:
        case URX_BACKSLASH_X:   // Grahpeme Cluster.  Minimum is 1, max unbounded.
            currentLen = INT32_MAX;
            break;


            // Ops that match a max of one character (possibly two 16 bit code units.)
            //
        case URX_STATIC_SETREF:
        case URX_STAT_SETREF_N:
        case URX_SETREF:
        case URX_BACKSLASH_D:
        case URX_BACKSLASH_H:
        case URX_BACKSLASH_R:
        case URX_BACKSLASH_V:
        case URX_ONECHAR_I:
        case URX_DOTANY_ALL:
        case URX_DOTANY:
        case URX_DOTANY_UNIX:
            currentLen = safeIncrement(currentLen, 2);
            break;

            // Single literal character.  Increase current max length by one or two,
            //       depending on whether the char is in the supplementary range.
        case URX_ONECHAR:
            currentLen = safeIncrement(currentLen, 1);
            if (URX_VAL(op) > 0x10000) {
                currentLen = safeIncrement(currentLen, 1);
            }
            break;

            // Jumps.
            //
        case URX_JMP:
        case URX_JMPX:
        case URX_JMP_SAV:
        case URX_JMP_SAV_X:
            {
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest < loc) {
                    // Loop of some kind.  Max match length is unbounded.
                    currentLen = INT32_MAX;
                } else {
                    // Forward jump.  Propagate the current min length to the target loc of the jump.
                    if (forwardedLength.elementAti(jmpDest) < currentLen) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                    currentLen = 0;
                }
            }
            break;

        case URX_BACKTRACK:
            // back-tracks are kind of like a branch, except that the max length was
            //   propagated already, by the state save.
            currentLen = forwardedLength.elementAti(loc+1);
            break;


        case URX_STATE_SAVE:
            {
                // State Save, for forward jumps, propagate the current minimum.
                //               of the state save.
                //             For backwards jumps, they create a loop, maximum
                //               match length is unbounded.
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest > loc) {
                    if (currentLen > forwardedLength.elementAti(jmpDest)) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                } else {
                    currentLen = INT32_MAX;
                }
            }
            break;




        case URX_STRING:
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                currentLen = safeIncrement(currentLen, URX_VAL(stringLenOp));
                break;
            }

        case URX_STRING_I:
            // TODO:  This code assumes that any user string that matches will be no longer
            //        than our compiled string, with case insensitive matching.
            //        Our compiled string has been case-folded already.
            //
            //        Any matching user string will have no more code points than our
            //        compiled (folded) string.  Folding may add code points, but
            //        not remove them.
            //
            //        There is a potential problem if a supplemental code point
            //        case-folds to a BMP code point.  In this case our compiled string
            //        could be shorter (in code units) than a matching user string.
            //
            //        At this time (Unicode 6.1) there are no such characters, and this case
            //        is not being handled.  A test, intltest regex/Bug9283, will fail if
            //        any problematic characters are added to Unicode.
            //
            //        If this happens, we can make a set of the BMP chars that the
            //        troublesome supplementals fold to, scan our string, and bump the
            //        currentLen one extra for each that is found.
            //
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                currentLen = safeIncrement(currentLen, URX_VAL(stringLenOp));
            }
            break;

        case URX_CTR_INIT:
        case URX_CTR_INIT_NG:
            // For Loops, recursively call this function on the pattern for the loop body,
            //   then multiply the result by the maximum loop count.
            {
                int32_t  loopEndLoc = URX_VAL(fRXPat->fCompiledPat->elementAti(loc+1));
                if (loopEndLoc == loc+4) {
                    // Loop has an empty body. No affect on max match length.
                    // Continue processing with code after the loop end.
                    loc = loopEndLoc;
                    break;
                }

                int32_t maxLoopCount = static_cast<int32_t>(fRXPat->fCompiledPat->elementAti(loc+3));
                if (maxLoopCount == -1) {
                    // Unbounded Loop. No upper bound on match length.
                    currentLen = INT32_MAX;
                    break;
                }

                U_ASSERT(loopEndLoc >= loc+4);
                int64_t blockLen = maxMatchLength(loc+4, loopEndLoc-1);  // Recursive call.
                int64_t updatedLen = (int64_t)currentLen + blockLen * maxLoopCount; 
                if (updatedLen >= INT32_MAX) {
                    currentLen = INT32_MAX;
                    break;
                }
                currentLen = (int32_t)updatedLen;
                loc = loopEndLoc;
                break;
            }

        case URX_CTR_LOOP:
        case URX_CTR_LOOP_NG:
            // These opcodes will be skipped over by code for URX_CRT_INIT.
            // We shouldn't encounter them here.
            U_ASSERT(FALSE);
            break;

        case URX_LOOP_SR_I:
        case URX_LOOP_DOT_I:
        case URX_LOOP_C:
            // For anything to do with loops, make the match length unbounded.
            currentLen = INT32_MAX;
            break;



        case URX_LA_START:
        case URX_LA_END:
            // Look-ahead.  Just ignore, treat the look-ahead block as if
            // it were normal pattern.  Gives a too-long match length,
            //  but good enough for now.
            break;

            // End of look-ahead ops should always be consumed by the processing at
            //  the URX_LA_START op.
            // U_ASSERT(FALSE);
            // break;

        case URX_LB_START:
            {
                // Look-behind.  Scan forward until the matching look-around end,
                //   without processing the look-behind block.
                int32_t  depth = 0;
                for (;;) {
                    loc++;
                    op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                    if (URX_TYPE(op) == URX_LA_START || URX_TYPE(op) == URX_LB_START) {
                        depth++;
                    }
                    if (URX_TYPE(op) == URX_LA_END || URX_TYPE(op)==URX_LBN_END) {
                        if (depth == 0) {
                            break;
                        }
                        depth--;
                    }
                    U_ASSERT(loc < end);
                }
            }
            break;

        default:
            U_ASSERT(FALSE);
        }


        if (currentLen == INT32_MAX) {
            //  The maximum length is unbounded.
            //  Stop further processing of the pattern.
            break;
        }

    }
    return currentLen;

}